

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

photonstream * __thiscall
NEST::NESTcalc::AddPhotonTransportTime
          (photonstream *__return_storage_ptr__,NESTcalc *this,photonstream *emitted_times,double x,
          double y,double z)

{
  double dVar1;
  double *pdVar2;
  iterator __position;
  double *pdVar3;
  double extraout_XMM0_Qa;
  double newtime;
  double local_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar3 = (emitted_times->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (emitted_times->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar3 != pdVar2) {
    do {
      dVar1 = *pdVar3;
      (*this->fdetector->_vptr_VDetector[8])(x,y,z);
      local_30 = dVar1 + extraout_XMM0_Qa;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_30);
      }
      else {
        *__position._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != pdVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

photonstream NESTcalc::AddPhotonTransportTime(const photonstream &emitted_times,
                                              double x, double y, double z) {
  photonstream return_photons;
  for (auto t : emitted_times) {
    double newtime = t + fdetector->OptTrans(x, y, z);
    return_photons.emplace_back(newtime);
  }
  return return_photons;
}